

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_ThrustThing(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *it_00;
  DAngle local_38;
  DAngle local_30;
  FActorIterator iterator;
  
  if (arg3 == 0) {
    if (it == (AActor *)0x0) {
      return 0;
    }
    if ((level.flags2._2_1_ >> 7 & backSide) != 0) {
      return 0;
    }
    local_30.Degrees = (double)arg0 * 1.40625;
    ThrustThingHelper(it,&local_30,(double)arg1,arg2);
  }
  else {
    iterator.base = (AActor *)0x0;
    iterator.id = arg3;
    while (it_00 = FActorIterator::Next(&iterator), it_00 != (AActor *)0x0) {
      local_38.Degrees = (double)arg0 * 1.40625;
      ThrustThingHelper(it_00,&local_38,(double)arg1,arg2);
    }
  }
  return 1;
}

Assistant:

FUNC(LS_ThrustThing)
// ThrustThing (angle, force, nolimit, tid)
{
	if (arg3 != 0)
	{
		FActorIterator iterator (arg3);
		while ((it = iterator.Next()) != NULL)
		{
			ThrustThingHelper (it, BYTEANGLE(arg0), arg1, arg2);
		}
		return true;
	}
	else if (it)
	{
		if (level.flags2 & LEVEL2_HEXENHACK && backSide)
		{
			return false;
		}
		ThrustThingHelper (it, BYTEANGLE(arg0), arg1, arg2);
		return true;
	}
	return false;
}